

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling_p.h
# Opt level: O1

QRect QHighDpi::fromNativePixels<QRect,QWidgetWindow>(QRect *value,QWidgetWindow *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  double extraout_XMM0_Qa;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar17;
  undefined1 auVar16 [16];
  QRect QVar18;
  
  uVar6 = QHighDpiScaling::scaleAndOrigin(&context->super_QWindow,(Point)ZEXT812(0));
  uVar1 = value->x1;
  uVar3 = value->y1;
  uVar2 = value->x2;
  uVar4 = value->y2;
  iVar8 = (int)((ulong)uVar6 >> 0x20);
  dVar12 = 1.0 / extraout_XMM0_Qa;
  dVar15 = (double)(uVar3 - iVar8) * dVar12;
  dVar17 = (double)(uVar1 - (int)uVar6) * dVar12;
  dVar13 = dVar12 * (double)((uVar4 - uVar3) + 1);
  dVar12 = dVar12 * (double)((uVar2 - uVar1) + 1);
  auVar14._0_8_ = (double)((ulong)dVar15 & 0x8000000000000000 | 0x3fe0000000000000) + dVar15;
  auVar14._8_8_ = (double)((ulong)dVar17 & 0x8000000000000000 | 0x3fe0000000000000) + dVar17;
  auVar11._0_8_ = (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000) + dVar13;
  auVar11._8_8_ = (double)((ulong)dVar12 & 0x8000000000000000 | 0x3fe0000000000000) + dVar12;
  auVar14 = minpd(_DAT_0066f5d0,auVar14);
  auVar11 = minpd(_DAT_0066f5d0,auVar11);
  auVar16._4_4_ = -(uint)(-2147483648.0 < auVar11._8_8_);
  auVar16._0_4_ = -(uint)(-2147483648.0 < auVar11._0_8_);
  auVar16._8_4_ = -(uint)(-2147483648.0 < auVar14._0_8_);
  auVar16._12_4_ = -(uint)(-2147483648.0 < auVar14._8_8_);
  uVar10 = movmskps((int)context,auVar16);
  iVar7 = (int)auVar14._8_8_;
  if ((uVar10 & 8) == 0) {
    iVar7 = -0x80000000;
  }
  iVar9 = (int)auVar14._0_8_;
  if ((uVar10 & 4) == 0) {
    iVar9 = -0x80000000;
  }
  iVar7 = iVar7 + (int)uVar6;
  iVar9 = iVar9 + iVar8;
  iVar8 = (int)auVar11._8_8_;
  if ((uVar10 & 2) == 0) {
    iVar8 = -0x80000000;
  }
  iVar5 = (int)auVar11._0_8_;
  if ((uVar10 & 1) == 0) {
    iVar5 = -0x80000000;
  }
  QVar18.x2.m_i = iVar8 + iVar7 + -1;
  QVar18.y1.m_i = iVar9;
  QVar18.x1.m_i = iVar7;
  QVar18.y2.m_i = iVar5 + iVar9 + -1;
  return QVar18;
}

Assistant:

T fromNativePixels(const T &value, const C *context)
{
    QHighDpiScaling::ScaleAndOrigin so = QHighDpiScaling::scaleAndOrigin(context);
    return scale(value, qreal(1) / so.factor, so.origin);
}